

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmlinuxalsa.c
# Opt level: O1

PmError alsa_use_queue(void)

{
  int iVar1;
  PmError PVar2;
  long lVar3;
  size_t __n;
  undefined1 *__s;
  undefined8 uStack_20;
  undefined1 auStack_18 [8];
  
  if (queue_used == 0) {
    uStack_20 = 0x104ec1;
    queue = snd_seq_alloc_queue(seq);
    iVar1 = queue;
    if (-1 < queue) {
      uStack_20 = 0x104ed4;
      lVar3 = snd_seq_queue_tempo_sizeof();
      lVar3 = -(lVar3 + 0xfU & 0xfffffffffffffff0);
      __s = auStack_18 + lVar3;
      *(undefined8 *)(auStack_18 + lVar3 + -8) = 0x104eea;
      __n = snd_seq_queue_tempo_sizeof();
      *(undefined8 *)(auStack_18 + lVar3 + -8) = 0x104ef7;
      memset(__s,0,__n);
      *(undefined8 *)(auStack_18 + lVar3 + -8) = 0x104f04;
      snd_seq_queue_tempo_set_tempo(__s,480000);
      *(undefined8 *)(auStack_18 + lVar3 + -8) = 0x104f11;
      snd_seq_queue_tempo_set_ppq(__s,0x1e0);
      *(undefined8 *)(auStack_18 + lVar3 + -8) = 0x104f26;
      pm_hosterror = snd_seq_set_queue_tempo(seq,queue,__s);
      iVar1 = pm_hosterror;
      if (-1 < pm_hosterror) {
        *(undefined8 *)(auStack_18 + lVar3 + -8) = 0x104f4f;
        snd_seq_control_queue(seq,queue,0x1e,0,0);
        *(undefined8 *)(auStack_18 + lVar3 + -8) = 0x104f5b;
        snd_seq_drain_output(seq);
        goto LAB_00104ea8;
      }
    }
    pm_hosterror = iVar1;
    PVar2 = pmHostError;
  }
  else {
LAB_00104ea8:
    queue_used = queue_used + 1;
    PVar2 = pmNoData;
  }
  return PVar2;
}

Assistant:

static PmError alsa_use_queue(void)
{
    if (queue_used == 0) {
        snd_seq_queue_tempo_t *tempo;

        queue = snd_seq_alloc_queue(seq);
        if (queue < 0) {
            pm_hosterror = queue;
            return pmHostError;
        }
        snd_seq_queue_tempo_alloca(&tempo);
        snd_seq_queue_tempo_set_tempo(tempo, 480000);
        snd_seq_queue_tempo_set_ppq(tempo, 480);
        pm_hosterror = snd_seq_set_queue_tempo(seq, queue, tempo);
        if (pm_hosterror < 0)
            return pmHostError;

        snd_seq_start_queue(seq, queue, NULL);
        snd_seq_drain_output(seq);
    }
    ++queue_used;
    return pmNoError;
}